

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall
tonk::gateway::StateMachine::BeginGatewayXMLRequest(StateMachine *this,int gatewayIndex)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  element_type *buffer_00;
  int in_ESI;
  undefined8 *in_RDI;
  Result result;
  string request;
  ostringstream oss;
  ParsedURL url;
  shared_ptr<tonk::gateway::HTTPRequester> requester;
  LogStringBuffer buffer;
  shared_ptr<tonk::gateway::HTTPRequester> *in_stack_fffffffffffff938;
  LogStringBuffer *in_stack_fffffffffffff940;
  anon_class_184_3_6e12eec6 *in_stack_fffffffffffff948;
  function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)>
  *in_stack_fffffffffffff950;
  undefined8 *puVar4;
  ParsedURL *in_stack_fffffffffffff968;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  OutputWorker *this_00;
  string local_640 [40];
  int local_618;
  HTTPCallback *in_stack_fffffffffffffa78;
  string *in_stack_fffffffffffffa80;
  AsioHost *in_stack_fffffffffffffa88;
  ParsedURL *in_stack_fffffffffffffa90;
  HTTPRequester *in_stack_fffffffffffffa98;
  long local_548;
  string local_540 [32];
  ostringstream local_520 [424];
  string local_378 [32];
  string local_358 [32];
  ushort local_338;
  undefined4 local_2ec;
  __shared_ptr local_2e8 [20];
  int local_2d4;
  long *local_2c8;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  string *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_2d4 = in_ESI;
  pvVar2 = std::
           vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
           operator[]((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                       *)(in_RDI + 0xe),(long)in_ESI);
  pvVar2->RetriesRemaining = pvVar2->RetriesRemaining + -1;
  MakeSharedNoThrow<tonk::gateway::HTTPRequester>();
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2e8);
  if (bVar1) {
    std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
    operator[]((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                *)(in_RDI + 0xe),(long)local_2d4);
    ParsedURL::ParsedURL
              ((ParsedURL *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               in_stack_fffffffffffff968);
    std::__cxx11::ostringstream::ostringstream(local_520);
    poVar3 = std::operator<<((ostream *)local_520,"GET /");
    poVar3 = std::operator<<(poVar3,local_378);
    std::operator<<(poVar3," HTTP/1.1\r\n");
    poVar3 = std::operator<<((ostream *)local_520,"Host: ");
    poVar3 = std::operator<<(poVar3,local_358);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_338);
    std::operator<<(poVar3,"\r\n");
    std::operator<<((ostream *)local_520,
                    "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n");
    std::__cxx11::ostringstream::str();
    buffer_00 = std::
                __shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x19ed47);
    this_00 = (OutputWorker *)*in_RDI;
    local_618 = local_2d4;
    ParsedURL::ParsedURL
              ((ParsedURL *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               in_stack_fffffffffffff968);
    std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>::
    function<tonk::gateway::StateMachine::BeginGatewayXMLRequest(int)::__0,void>
              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    HTTPRequester::Begin
              (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    std::function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)>::~function
              ((function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)> *)
               0x19ede1);
    BeginGatewayXMLRequest(int)::$_0::~__0((anon_class_184_3_6e12eec6 *)0x19edee);
    local_2c8 = &local_548;
    if (local_548 == 0) {
      std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
      operator[]((vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                  *)(in_RDI + 0xe),(long)local_2d4);
      std::shared_ptr<tonk::gateway::HTTPRequester>::operator=
                ((shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffff940,
                 in_stack_fffffffffffff938);
      local_2ec = 0;
    }
    else {
      Result::ToJson_abi_cxx11_((Result *)in_stack_fffffffffffff968);
      local_2b0 = &ModuleLogger;
      local_2b8 = "Failed to start web request: ";
      local_2c0 = local_640;
      local_290 = &ModuleLogger;
      local_294 = 4;
      local_2a0 = "Failed to start web request: ";
      local_280 = &ModuleLogger;
      local_284 = 4;
      local_2a8 = local_2c0;
      if (DAT_002b61e8 < 5) {
        local_c8 = &ModuleLogger;
        local_cc = 4;
        local_d8 = "Failed to start web request: ";
        local_e0 = local_2c0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938,Trace);
        local_b0 = &DAT_002b6218;
        local_a0 = &ModuleLogger;
        local_a8 = local_268;
        local_b8 = local_d8;
        local_c0 = local_e0;
        local_88 = &ModuleLogger;
        local_98 = local_b0;
        local_90 = local_a8;
        local_80 = local_b0;
        local_78 = local_a8;
        std::operator<<(aoStack_258,(string *)&DAT_002b6218);
        local_58 = &ModuleLogger;
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        puVar4 = &ModuleLogger;
        local_18 = &ModuleLogger;
        local_20 = local_a8;
        local_28 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_48 = local_60;
        local_50 = local_70;
        local_30 = local_60;
        local_38 = local_70;
        local_40 = puVar4;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19f17e);
      }
      std::__cxx11::string::~string(local_640);
      local_2ec = 1;
    }
    Result::~Result((Result *)in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_540);
    std::__cxx11::ostringstream::~ostringstream(local_520);
    ParsedURL::~ParsedURL((ParsedURL *)in_stack_fffffffffffff940);
  }
  else {
    local_2ec = 1;
  }
  std::shared_ptr<tonk::gateway::HTTPRequester>::~shared_ptr
            ((shared_ptr<tonk::gateway::HTTPRequester> *)0x19f31b);
  return;
}

Assistant:

void StateMachine::BeginGatewayXMLRequest(int gatewayIndex)
{
    // Decrement retry count
    GatewayEndpoints[gatewayIndex].RetriesRemaining--;

    std::shared_ptr<HTTPRequester> requester = MakeSharedNoThrow<HTTPRequester>();
    if (!requester) {
        return;
    }

    ParsedURL url = GatewayEndpoints[gatewayIndex].URL;

    std::ostringstream oss;
    oss << "GET /" << url.XMLPath << " HTTP/1.1\r\n";
    oss << "Host: " << url.IP << ":" << url.Port << "\r\n";
    oss << "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n";
    std::string request = oss.str();

    Result result = requester->Begin(
        url,
        Host,
        request,
        [this, gatewayIndex, url](
            const Result& result,
            unsigned code,
            const char* response,
            unsigned bytes)
    {
        if (result.IsFail()) {
            ModuleLogger.Error("Request for XML description failed: ", result.ToJson());
            return;
        }

        // Stop trying if we got a response
        this->GatewayEndpoints[gatewayIndex].RetriesRemaining = 0;

        // Request is now considered completed
        this->GatewayEndpoints[gatewayIndex].Completed = true;

        // If HTTP response code was not 200 OK:
        if (code != 200) {
            ModuleLogger.Error("Request for XML description failed. Server returned error code: ", code);
            return;
        }

        // Parse XML response
        ParsedXML xml;
        Result parseResult = xml.Parse(response, bytes);
        if (parseResult.IsFail()) {
            ModuleLogger.Error("Failed to parse XML: ", parseResult.ToJson());
            return;
        }

        // Handle response
        this->OnXMLResponse(url, xml);
    });

    if (result.IsFail()) {
        ModuleLogger.Error("Failed to start web request: ", result.ToJson());
        return;
    }

    GatewayEndpoints[gatewayIndex].Requester = requester;
}